

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

void pybind11::detail::clear_patients(PyObject *self)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  long *plVar4;
  internals *piVar5;
  iterator __it;
  long in_RDI;
  iterator __end2;
  PyObject **patient;
  undefined8 *puVar6;
  key_type local_30;
  
  piVar5 = get_internals();
  __it = std::
         _Hashtable<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(piVar5->patients)._M_h,&local_30);
  puVar1 = *(undefined8 **)
            ((long)__it.
                   super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                   ._M_cur + 0x10);
  puVar2 = *(undefined8 **)
            ((long)__it.
                   super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                   ._M_cur + 0x18);
  lVar3 = *(long *)((long)__it.
                          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                          ._M_cur + 0x20);
  *(undefined8 *)
   ((long)__it.
          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
          ._M_cur + 0x10) = 0;
  *(undefined8 *)
   ((long)__it.
          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
          ._M_cur + 0x18) = 0;
  *(undefined8 *)
   ((long)__it.
          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
          ._M_cur + 0x20) = 0;
  std::
  _Hashtable<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(piVar5->patients)._M_h,
          (const_iterator)
          __it.
          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
          ._M_cur);
  *(byte *)(in_RDI + 0x30) = *(byte *)(in_RDI + 0x30) & 0xef;
  for (puVar6 = puVar1; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    plVar4 = (long *)*puVar6;
    if (plVar4 != (long *)0x0) {
      *puVar6 = 0;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        _Py_Dealloc();
      }
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    operator_delete(puVar1,lVar3 - (long)puVar1);
  }
  return;
}

Assistant:

inline void clear_patients(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);
    auto &internals = get_internals();
    auto pos = internals.patients.find(self);
    assert(pos != internals.patients.end());
    // Clearing the patients can cause more Python code to run, which
    // can invalidate the iterator. Extract the vector of patients
    // from the unordered_map first.
    auto patients = std::move(pos->second);
    internals.patients.erase(pos);
    instance->has_patients = false;
    for (PyObject *&patient : patients)
        Py_CLEAR(patient);
}